

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O2

bool __thiscall draco::PointCloudEncoder::EncodePointAttributes(PointCloudEncoder *this)

{
  pointer puVar1;
  AttributesEncoder *pAVar2;
  uint *puVar3;
  int *piVar4;
  __uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> _Var5;
  bool bVar6;
  char cVar7;
  int iVar8;
  unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> *att_enc;
  pointer puVar9;
  uint *puVar10;
  int *piVar11;
  uchar local_19;
  
  iVar8 = (*this->_vptr_PointCloudEncoder[8])();
  if ((char)iVar8 == '\0') {
    return (bool)0;
  }
  local_19 = (uchar)((uint)(*(int *)&(this->attributes_encoders_).
                                     super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->attributes_encoders_).
                                    super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
  EncoderBuffer::Encode<unsigned_char>(this->buffer_,&local_19);
  puVar9 = (this->attributes_encoders_).
           super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->attributes_encoders_).
           super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar9 == puVar1) {
      bVar6 = RearrangeAttributesEncoders(this);
      if (!bVar6) {
        return (bool)0;
      }
      puVar10 = (uint *)(this->attributes_encoder_ids_order_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      puVar3 = (uint *)(this->attributes_encoder_ids_order_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish;
      do {
        if (puVar10 == puVar3) {
          piVar11 = (this->attributes_encoder_ids_order_).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          piVar4 = (this->attributes_encoder_ids_order_).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
          do {
            if (piVar11 == piVar4) {
              iVar8 = (*this->_vptr_PointCloudEncoder[0xb])(this);
              return (bool)(char)iVar8;
            }
            _Var5._M_t.
            super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
            .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
                 (this->attributes_encoders_).
                 super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[*piVar11]._M_t.
                 super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                 ._M_t;
            cVar7 = (**(code **)(*(long *)_Var5._M_t.
                                          super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                          .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                          _M_head_impl + 0x18))
                              (_Var5._M_t.
                               super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                               .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                               _M_head_impl,this->buffer_);
            piVar11 = piVar11 + 1;
          } while (cVar7 != '\0');
          return (bool)0;
        }
        iVar8 = (*this->_vptr_PointCloudEncoder[10])(this,(ulong)*puVar10);
        puVar10 = puVar10 + 1;
      } while ((char)iVar8 != '\0');
      return false;
    }
    pAVar2 = (puVar9->_M_t).
             super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
             .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl;
    iVar8 = (*pAVar2->_vptr_AttributesEncoder[2])(pAVar2,this,this->point_cloud_);
    puVar9 = puVar9 + 1;
  } while ((char)iVar8 != '\0');
  return (bool)0;
}

Assistant:

bool PointCloudEncoder::EncodePointAttributes() {
  if (!GenerateAttributesEncoders()) {
    return false;
  }

  // Encode the number of attribute encoders.
  buffer_->Encode(static_cast<uint8_t>(attributes_encoders_.size()));

  // Initialize all the encoders (this is used for example to init attribute
  // dependencies, no data is encoded in this step).
  for (auto &att_enc : attributes_encoders_) {
    if (!att_enc->Init(this, point_cloud_)) {
      return false;
    }
  }

  // Rearrange attributes to respect dependencies between individual attributes.
  if (!RearrangeAttributesEncoders()) {
    return false;
  }

  // Encode any data that is necessary to create the corresponding attribute
  // decoder.
  for (int att_encoder_id : attributes_encoder_ids_order_) {
    if (!EncodeAttributesEncoderIdentifier(att_encoder_id)) {
      return false;
    }
  }

  // Also encode any attribute encoder data (such as the info about encoded
  // attributes).
  for (int att_encoder_id : attributes_encoder_ids_order_) {
    if (!attributes_encoders_[att_encoder_id]->EncodeAttributesEncoderData(
            buffer_)) {
      return false;
    }
  }

  // Lastly encode all the attributes using the provided attribute encoders.
  if (!EncodeAllAttributes()) {
    return false;
  }
  return true;
}